

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMessage(google::protobuf::Descriptor*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  ushort *puVar1;
  FieldDescriptor *pFVar2;
  Arg *in_R9;
  string_view format;
  Arg local_70;
  ulong local_40;
  long local_38;
  
  pFVar2 = google::protobuf::Descriptor::field
                     ((Descriptor *)**(undefined8 **)this,**(int **)(this + 8) + -1);
  puVar1 = (ushort *)(pFVar2->all_names_).payload_;
  local_40 = (ulong)*puVar1;
  local_38 = (long)puVar1 + ~local_40;
  local_70.piece_._M_len = (size_t)**(ushort **)(**(long **)(this + 0x10) + 8);
  local_70.piece_._M_str =
       (char *)(~local_70.piece_._M_len + (long)*(ushort **)(**(long **)(this + 0x10) + 8));
  format._M_str = (char *)&local_40;
  format._M_len =
       (size_t)
       "Fields in the same oneof must be defined consecutively. \"$0\" cannot be defined before the completion of the \"$1\" oneof definition."
  ;
  Substitute_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)0x82,format,&local_70,in_R9);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}